

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall inject::no_component::no_component(no_component *this,string *name)

{
  ostream *poVar1;
  stringstream oss;
  string asStack_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  *(undefined ***)this = &PTR__no_component_00114830;
  this->_id = -1;
  std::__cxx11::string::string((string *)&this->_name,(string *)name);
  (this->_msg)._M_dataplus._M_p = (pointer)&(this->_msg).field_2;
  (this->_msg)._M_string_length = 0;
  (this->_msg).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"no such component \'");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,"\'");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_msg,asStack_1b8);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

no_component(const std::string& name) throw() :
            exception(), _id(INVALID_ID), _name(name) {
        std::stringstream oss;
        oss << "no such component '" << name << "'";
        _msg = oss.str();
    }